

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool roaring_bitmap_select(roaring_bitmap_t *bm,uint32_t rank,uint32_t *element)

{
  uint *in_RDX;
  undefined4 in_ESI;
  int *in_RDI;
  _Bool valid;
  int i;
  uint32_t start_rank;
  uint16_t key;
  uint8_t typecode;
  container_t *container;
  undefined2 in_stack_ffffffffffffffc8;
  bool bVar1;
  _Bool _Var2;
  int iVar3;
  uint32_t in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe8;
  
  iVar3 = 0;
  _Var2 = false;
  while( true ) {
    bVar1 = false;
    if (_Var2 == false) {
      bVar1 = iVar3 < *in_RDI;
    }
    if (bVar1 == false) break;
    in_stack_ffffffffffffffd4 =
         CONCAT13(*(undefined1 *)(*(long *)(in_RDI + 6) + (long)iVar3),
                  (int3)in_stack_ffffffffffffffd4);
    _Var2 = container_select((container_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                             (uint8_t)((ulong)in_RDX >> 0x38),
                             *(uint32_t **)(*(long *)(in_RDI + 2) + (long)iVar3 * 8),
                             in_stack_ffffffffffffffd4,
                             (uint32_t *)
                             CONCAT44(iVar3,CONCAT13(_Var2,CONCAT12(bVar1,in_stack_ffffffffffffffc8)
                                                    )));
    iVar3 = iVar3 + 1;
  }
  if (_Var2 != false) {
    *in_RDX = (uint)*(ushort *)(*(long *)(in_RDI + 4) + (long)(iVar3 + -1) * 2) << 0x10 | *in_RDX;
  }
  return _Var2 != false;
}

Assistant:

bool roaring_bitmap_select(const roaring_bitmap_t *bm, uint32_t rank,
                           uint32_t *element) {
    container_t *container;
    uint8_t typecode;
    uint16_t key;
    uint32_t start_rank = 0;
    int i = 0;
    bool valid = false;
    while (!valid && i < bm->high_low_container.size) {
        container = bm->high_low_container.containers[i];
        typecode = bm->high_low_container.typecodes[i];
        valid =
            container_select(container, typecode, &start_rank, rank, element);
        i++;
    }

    if (valid) {
        key = bm->high_low_container.keys[i - 1];
        *element |= (((uint32_t)key) << 16);  // w/o cast, key promotes signed
        return true;
    } else
        return false;
}